

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_quic_transport_params_parse_serverhello_impl
               (SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents,bool used_legacy_codepoint)

{
  SSL *ssl_00;
  SSL3_STATE *pSVar1;
  uint16_t uVar2;
  int iVar3;
  Span<const_unsigned_char> in;
  SSL *ssl;
  bool used_legacy_codepoint_local;
  CBS *contents_local;
  uint8_t *out_alert_local;
  SSL_HANDSHAKE *hs_local;
  
  ssl_00 = hs->ssl;
  if (contents == (CBS *)0x0) {
    if (used_legacy_codepoint ==
        (bool)((byte)((ushort)*(undefined2 *)&hs->config->field_0x10d >> 9) & 1)) {
      iVar3 = SSL_is_quic(ssl_00);
      if (iVar3 == 0) {
        hs_local._7_1_ = true;
      }
      else {
        *out_alert = 'm';
        hs_local._7_1_ = false;
      }
    }
    else {
      hs_local._7_1_ = true;
    }
  }
  else {
    iVar3 = SSL_is_quic(ssl_00);
    if (iVar3 == 0) {
      __assert_fail("SSL_is_quic(ssl)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0xaf9,
                    "bool bssl::ext_quic_transport_params_parse_serverhello_impl(SSL_HANDSHAKE *, uint8_t *, CBS *, bool)"
                   );
    }
    uVar2 = ssl_protocol_version(ssl_00);
    if (uVar2 != 0x304) {
      __assert_fail("ssl_protocol_version(ssl) == TLS1_3_VERSION",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0xafa,
                    "bool bssl::ext_quic_transport_params_parse_serverhello_impl(SSL_HANDSHAKE *, uint8_t *, CBS *, bool)"
                   );
    }
    if (used_legacy_codepoint !=
        (bool)((byte)((ushort)*(undefined2 *)&hs->config->field_0x10d >> 9) & 1)) {
      __assert_fail("used_legacy_codepoint == hs->config->quic_use_legacy_codepoint",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0xafb,
                    "bool bssl::ext_quic_transport_params_parse_serverhello_impl(SSL_HANDSHAKE *, uint8_t *, CBS *, bool)"
                   );
    }
    pSVar1 = ssl_00->s3;
    in = cbs_st::operator_cast_to_Span(contents);
    hs_local._7_1_ = Array<unsigned_char>::CopyFrom(&pSVar1->peer_quic_transport_params,in);
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_quic_transport_params_parse_serverhello_impl(
    SSL_HANDSHAKE *hs, uint8_t *out_alert, CBS *contents,
    bool used_legacy_codepoint) {
  SSL *const ssl = hs->ssl;
  if (contents == nullptr) {
    if (used_legacy_codepoint != hs->config->quic_use_legacy_codepoint) {
      // Silently ignore because we expect the other QUIC codepoint.
      return true;
    }
    if (!SSL_is_quic(ssl)) {
      return true;
    }
    *out_alert = SSL_AD_MISSING_EXTENSION;
    return false;
  }
  // The extensions parser will check for unsolicited extensions before
  // calling the callback.
  assert(SSL_is_quic(ssl));
  assert(ssl_protocol_version(ssl) == TLS1_3_VERSION);
  assert(used_legacy_codepoint == hs->config->quic_use_legacy_codepoint);
  return ssl->s3->peer_quic_transport_params.CopyFrom(*contents);
}